

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

PositionalBase * __thiscall args::Command::GetNextPositional(Command *this)

{
  bool bVar1;
  Options OVar2;
  int iVar3;
  uint uVar4;
  reference ppBVar5;
  undefined4 extraout_var;
  Group *in_RDI;
  PositionalBase *res_1;
  Base *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range3;
  PositionalBase *res;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  *in_stack_ffffffffffffffb0;
  Group *in_stack_ffffffffffffffc8;
  Base *this_00;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_28;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *local_20;
  PositionalBase *local_18;
  PositionalBase *local_8;
  
  if (in_RDI[2].validator._M_invoker == (_Invoker_type)0x0) {
    if (in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      uVar4 = (*(in_RDI->super_Base)._vptr_Base[2])();
      if ((uVar4 & 1) == 0) {
        local_8 = (PositionalBase *)0x0;
      }
      else {
        local_8 = Group::GetNextPositional(in_stack_ffffffffffffffc8);
      }
    }
    else {
      local_8 = (PositionalBase *)
                (**(code **)&(*in_RDI[3].children.
                               super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish)[1].help)();
    }
  }
  else {
    local_18 = (PositionalBase *)(**(code **)(*(long *)in_RDI[2].validator._M_invoker + 0x40))();
    local_8 = local_18;
    if (local_18 == (PositionalBase *)0x0) {
      local_20 = Group::Children(in_RDI);
      local_28._M_current =
           (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                              (in_stack_ffffffffffffffa8);
      std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffffa8);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffffb0,
                                (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                 *)in_stack_ffffffffffffffa8), bVar1) {
        ppBVar5 = __gnu_cxx::
                  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                  ::operator*(&local_28);
        this_00 = *ppBVar5;
        OVar2 = Base::GetOptions(this_00);
        OVar2 = operator&(OVar2,Global);
        if (OVar2 != None) {
          iVar3 = (*this_00->_vptr_Base[8])();
          if ((PositionalBase *)CONCAT44(extraout_var,iVar3) != (PositionalBase *)0x0) {
            return (PositionalBase *)CONCAT44(extraout_var,iVar3);
          }
        }
        __gnu_cxx::
        __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
        ::operator++(&local_28);
      }
      local_8 = (PositionalBase *)0x0;
    }
  }
  return local_8;
}

Assistant:

virtual PositionalBase *GetNextPositional() override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->GetNextPositional())
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->GetNextPositional())
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->GetNextPositional();
                }

                return Matched() ? Group::GetNextPositional() : nullptr;
            }